

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O2

dict_t * dict_init(ps_config_t *config,bin_mdef_t *mdef)

{
  char *pcVar1;
  bin_mdef_t *pbVar2;
  int iVar3;
  s3wid_t sVar4;
  char *pcVar5;
  char *__filename;
  FILE *pFVar6;
  lineiter_t *plVar7;
  dict_t *d;
  dictword_t *pdVar8;
  bin_mdef_t *pbVar9;
  hash_table_t *phVar10;
  long ln;
  uint uVar11;
  uint uVar12;
  s3cipid_t local_4a;
  FILE *local_48;
  bin_mdef_t *local_40;
  char *local_38;
  
  local_40 = mdef;
  if (config == (ps_config_t *)0x0) {
    pFVar6 = (FILE *)0x0;
    pcVar5 = (char *)0x0;
    __filename = (char *)0x0;
    local_48 = (FILE *)0x0;
    uVar12 = 0;
  }
  else {
    pcVar5 = ps_config_str(config,"dict");
    __filename = ps_config_str(config,"fdict");
    if (pcVar5 == (char *)0x0) {
      pFVar6 = (FILE *)0x0;
      uVar12 = 0;
    }
    else {
      pFVar6 = fopen(pcVar5,"r");
      if (pFVar6 == (FILE *)0x0) {
        err_msg_system(ERR_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                       ,0x111,"Failed to open dictionary file \'%s\' for reading",pcVar5);
        return (dict_t *)0x0;
      }
      plVar7 = lineiter_start((FILE *)pFVar6);
      uVar12 = 0;
      for (; plVar7 != (lineiter_t *)0x0; plVar7 = lineiter_next(plVar7)) {
        pcVar1 = plVar7->buf;
        if (*pcVar1 == ';') {
          uVar11 = (uint)(pcVar1[1] != ';');
LAB_001218aa:
          uVar12 = uVar12 + uVar11;
        }
        else {
          uVar11 = 1;
          if ((*pcVar1 != '#') || (uVar11 = 1, pcVar1[1] != '#')) goto LAB_001218aa;
        }
      }
      fseek(pFVar6,0,0);
    }
    if (__filename == (char *)0x0) {
      __filename = (char *)0x0;
      local_48 = (FILE *)0x0;
    }
    else {
      local_48 = fopen(__filename,"r");
      if (local_48 == (FILE *)0x0) {
        err_msg_system(ERR_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                       ,0x11f,"Failed to open filler dictionary file \'%s\' for reading",__filename)
        ;
        fclose(pFVar6);
        return (dict_t *)0x0;
      }
      for (plVar7 = lineiter_start((FILE *)local_48); plVar7 != (lineiter_t *)0x0;
          plVar7 = lineiter_next(plVar7)) {
        pcVar1 = plVar7->buf;
        if (*pcVar1 == ';') {
          uVar11 = (uint)(pcVar1[1] != ';');
LAB_00121945:
          uVar12 = uVar12 + uVar11;
        }
        else {
          uVar11 = 1;
          if ((*pcVar1 != '#') || (uVar11 = 1, pcVar1[1] != '#')) goto LAB_00121945;
        }
      }
      fseek(local_48,0,0);
    }
  }
  d = (dict_t *)
      __ckd_calloc__(1,0x40,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                     ,0x12f);
  uVar11 = 0x7fffeffe;
  if ((int)uVar12 < 0x7fffeffe) {
    uVar11 = uVar12;
  }
  d->refcnt = 1;
  uVar11 = uVar11 + 0x1000;
  d->max_words = uVar11;
  if (0x7ffffffd < (int)uVar12) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c",
            0x135,"Number of words in dictionaries (%d) exceeds limit (%d)\n",(ulong)uVar12,
            0x7ffffffe);
    if (pFVar6 != (FILE *)0x0) {
      fclose(pFVar6);
    }
    if (local_48 != (FILE *)0x0) {
      fclose(local_48);
    }
    ckd_free(d);
    return (dict_t *)0x0;
  }
  local_38 = __filename;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c",
          0x13e,"Allocating %d * %d bytes (%d KiB) for word entries\n",(ulong)uVar11,0x20,
          (ulong)(long)(int)uVar11 >> 5 & 0x3fffffffffffff);
  pdVar8 = (dictword_t *)
           __ckd_calloc__((long)d->max_words,0x20,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                          ,0x13f);
  pbVar2 = local_40;
  d->word = pdVar8;
  d->n_word = 0;
  if (local_40 != (bin_mdef_t *)0x0) {
    pbVar9 = bin_mdef_retain(local_40);
    d->mdef = pbVar9;
  }
  if (config == (ps_config_t *)0x0) {
    iVar3 = d->nocase;
  }
  else {
    iVar3 = ps_config_bool(config,"dictcase");
    d->nocase = iVar3;
  }
  phVar10 = hash_table_new(d->max_words,iVar3);
  d->ht = phVar10;
  if (pFVar6 != (FILE *)0x0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c",
            0x14b,"Reading main dictionary: %s\n",pcVar5);
    dict_read((FILE *)pFVar6,d);
    fclose(pFVar6);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c",
            0x14e,"%d words read\n",(ulong)(uint)d->n_word);
  }
  sVar4 = dict_wordid(d,"<s>");
  if (sVar4 == -1) {
    sVar4 = dict_wordid(d,"</s>");
    if (sVar4 == -1) {
      sVar4 = dict_wordid(d,"<sil>");
      pFVar6 = local_48;
      if (sVar4 == -1) {
        d->filler_start = d->n_word;
        if (local_48 != (FILE *)0x0) {
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                  ,0x164,"Reading filler dictionary: %s\n",local_38);
          dict_read((FILE *)pFVar6,d);
          fclose(pFVar6);
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                  ,0x167,"%d words read\n",(ulong)(uint)(d->n_word - d->filler_start));
        }
        if (pbVar2 == (bin_mdef_t *)0x0) {
          local_4a = 0;
        }
        else {
          local_4a = (s3cipid_t)pbVar2->sil;
        }
        sVar4 = dict_wordid(d,"<s>");
        if (sVar4 == -1) {
          dict_add_word(d,"<s>",&local_4a,1);
        }
        sVar4 = dict_wordid(d,"</s>");
        if (sVar4 == -1) {
          dict_add_word(d,"</s>",&local_4a,1);
        }
        sVar4 = dict_wordid(d,"<sil>");
        if (sVar4 == -1) {
          dict_add_word(d,"<sil>",&local_4a,1);
        }
        d->filler_end = d->n_word + -1;
        sVar4 = dict_wordid(d,"<s>");
        d->startwid = sVar4;
        sVar4 = dict_wordid(d,"</s>");
        d->finishwid = sVar4;
        sVar4 = dict_wordid(d,"<sil>");
        d->silwid = sVar4;
        if ((d->filler_start <= d->filler_end) && (iVar3 = dict_filler_word(d,sVar4), iVar3 != 0)) {
          return d;
        }
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                ,0x181,"Word \'%s\' must occur (only) in filler dictionary\n","<sil>");
        goto LAB_00121bd4;
      }
      pcVar5 = "Remove silence word \'<sil>\' from the dictionary\n";
      ln = 0x15c;
    }
    else {
      pcVar5 = "Remove sentence start word \'</s>\' from the dictionary\n";
      ln = 0x157;
    }
  }
  else {
    pcVar5 = "Remove sentence start word \'<s>\' from the dictionary\n";
    ln = 0x152;
  }
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c",ln
          ,pcVar5);
LAB_00121bd4:
  dict_free(d);
  return (dict_t *)0x0;
}

Assistant:

dict_t *
dict_init(ps_config_t *config, bin_mdef_t * mdef)
{
    FILE *fp, *fp2;
    int32 n;
    lineiter_t *li;
    dict_t *d;
    s3cipid_t sil;
    char const *dictfile = NULL, *fillerfile = NULL;

    if (config) {
        dictfile = ps_config_str(config, "dict");
        fillerfile = ps_config_str(config, "fdict");
    }

    /*
     * First obtain #words in dictionary (for hash table allocation).
     * Reason: The PC NT system doesn't like to grow memory gradually.  Better to allocate
     * all the required memory in one go.
     */
    fp = NULL;
    n = 0;
    if (dictfile) {
        if ((fp = fopen(dictfile, "r")) == NULL) {
            E_ERROR_SYSTEM("Failed to open dictionary file '%s' for reading", dictfile);
            return NULL;
        }
        for (li = lineiter_start(fp); li; li = lineiter_next(li)) {
            if (0 != strncmp(li->buf, "##", 2)
                && 0 != strncmp(li->buf, ";;", 2))
                n++;
        }
	fseek(fp, 0L, SEEK_SET);
    }

    fp2 = NULL;
    if (fillerfile) {
        if ((fp2 = fopen(fillerfile, "r")) == NULL) {
            E_ERROR_SYSTEM("Failed to open filler dictionary file '%s' for reading", fillerfile);
            fclose(fp);
            return NULL;
	}
        for (li = lineiter_start(fp2); li; li = lineiter_next(li)) {
	    if (0 != strncmp(li->buf, "##", 2)
    	        && 0 != strncmp(li->buf, ";;", 2))
                n++;
        }
        fseek(fp2, 0L, SEEK_SET);
    }

    /*
     * Allocate dict entries.  HACK!!  Allow some extra entries for words not in file.
     * Also check for type size restrictions.
     */
    d = (dict_t *) ckd_calloc(1, sizeof(dict_t));       /* freed in dict_free() */
    d->refcnt = 1;
    d->max_words =
        (n + S3DICT_INC_SZ < MAX_S3WID) ? n + S3DICT_INC_SZ : MAX_S3WID;
    if (n >= MAX_S3WID) {
        E_ERROR("Number of words in dictionaries (%d) exceeds limit (%d)\n", n,
                MAX_S3WID);
        if (fp) fclose(fp);
        if (fp2) fclose(fp2);
        ckd_free(d);
        return NULL;
    }

    E_INFO("Allocating %d * %d bytes (%d KiB) for word entries\n",
           d->max_words, sizeof(dictword_t),
           d->max_words * sizeof(dictword_t) / 1024);
    d->word = (dictword_t *) ckd_calloc(d->max_words, sizeof(dictword_t));      /* freed in dict_free() */
    d->n_word = 0;
    if (mdef)
        d->mdef = bin_mdef_retain(mdef);

    /* Create new hash table for word strings; case-insensitive word strings */
    if (config)
        d->nocase = ps_config_bool(config, "dictcase");
    d->ht = hash_table_new(d->max_words, d->nocase);

    /* Digest main dictionary file */
    if (fp) {
        E_INFO("Reading main dictionary: %s\n", dictfile);
        dict_read(fp, d);
        fclose(fp);
        E_INFO("%d words read\n", d->n_word);
    }

    if (dict_wordid(d, S3_START_WORD) != BAD_S3WID) {
	E_ERROR("Remove sentence start word '<s>' from the dictionary\n");
	dict_free(d);
	return NULL;
    }
    if (dict_wordid(d, S3_FINISH_WORD) != BAD_S3WID) {
	E_ERROR("Remove sentence start word '</s>' from the dictionary\n");
	dict_free(d);
	return NULL;
    }
    if (dict_wordid(d, S3_SILENCE_WORD) != BAD_S3WID) {
	E_ERROR("Remove silence word '<sil>' from the dictionary\n");
	dict_free(d);
	return NULL;
    }

    /* Now the filler dictionary file, if it exists */
    d->filler_start = d->n_word;
    if (fp2) {
        E_INFO("Reading filler dictionary: %s\n", fillerfile);
        dict_read(fp2, d);
        fclose(fp2);
        E_INFO("%d words read\n", d->n_word - d->filler_start);
    }
    if (mdef)
        sil = bin_mdef_silphone(mdef);
    else
        sil = 0;
    if (dict_wordid(d, S3_START_WORD) == BAD_S3WID) {
        dict_add_word(d, S3_START_WORD, &sil, 1);
    }
    if (dict_wordid(d, S3_FINISH_WORD) == BAD_S3WID) {
        dict_add_word(d, S3_FINISH_WORD, &sil, 1);
    }
    if (dict_wordid(d, S3_SILENCE_WORD) == BAD_S3WID) {
        dict_add_word(d, S3_SILENCE_WORD, &sil, 1);
    }

    d->filler_end = d->n_word - 1;

    /* Initialize distinguished word-ids */
    d->startwid = dict_wordid(d, S3_START_WORD);
    d->finishwid = dict_wordid(d, S3_FINISH_WORD);
    d->silwid = dict_wordid(d, S3_SILENCE_WORD);

    if ((d->filler_start > d->filler_end)
        || (!dict_filler_word(d, d->silwid))) {
        E_ERROR("Word '%s' must occur (only) in filler dictionary\n",
                S3_SILENCE_WORD);
        dict_free(d);
        return NULL;
    }

    /* No check that alternative pronunciations for filler words are in filler range!! */

    return d;
}